

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

ExtPubkey * __thiscall
cfd::core::HDWallet::GeneratePubkey
          (ExtPubkey *__return_storage_ptr__,HDWallet *this,NetType network_type,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *path)

{
  ExtPrivkey privkey;
  ExtPrivkey local_90;
  
  ExtPrivkey::ExtPrivkey(&local_90,&this->seed_,network_type);
  ExtPrivkey::DerivePubkey(__return_storage_ptr__,&local_90,path);
  ExtPrivkey::~ExtPrivkey(&local_90);
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey HDWallet::GeneratePubkey(
    NetType network_type, const std::vector<uint32_t>& path) const {
  ExtPrivkey privkey(seed_, network_type);
  return privkey.DerivePubkey(path);
}